

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessUNIX.c
# Opt level: O0

int cmsysProcess_AddCommand(cmsysProcess *cp,char **command)

{
  int iVar1;
  char ***__ptr;
  char **ppcVar2;
  long lVar3;
  char *pcVar4;
  long lVar5;
  long local_50;
  kwsysProcess_ptrdiff_t i_1;
  kwsysProcess_ptrdiff_t n;
  char **c;
  int i;
  char ***newCommands;
  int newNumberOfCommands;
  char **command_local;
  cmsysProcess *cp_local;
  
  if (((cp == (cmsysProcess *)0x0) || (command == (char **)0x0)) || (*command == (char *)0x0)) {
    cp_local._4_4_ = 0;
  }
  else {
    iVar1 = cp->NumberOfCommands + 1;
    __ptr = (char ***)malloc((long)iVar1 << 3);
    if (__ptr == (char ***)0x0) {
      cp_local._4_4_ = 0;
    }
    else {
      for (c._4_4_ = 0; c._4_4_ < cp->NumberOfCommands; c._4_4_ = c._4_4_ + 1) {
        __ptr[c._4_4_] = cp->Commands[c._4_4_];
      }
      n = (kwsysProcess_ptrdiff_t)command;
      if (cp->Verbatim == 0) {
        do {
          lVar5 = n + 8;
          lVar3 = *(long *)n;
          n = lVar5;
        } while (lVar3 != 0);
        lVar3 = lVar5 - (long)command >> 3;
        lVar5 = lVar3 + -1;
        ppcVar2 = (char **)malloc(lVar3 * 8);
        __ptr[cp->NumberOfCommands] = ppcVar2;
        if (__ptr[cp->NumberOfCommands] == (char **)0x0) {
          free(__ptr);
          return 0;
        }
        for (local_50 = 0; local_50 < lVar5; local_50 = local_50 + 1) {
          if (command[local_50] == (char *)0x0) {
            __assert_fail("command[i]",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/kwsys/ProcessUNIX.c"
                          ,0x1bd,"int cmsysProcess_AddCommand(cmsysProcess *, const char *const *)")
            ;
          }
          pcVar4 = strdup(command[local_50]);
          __ptr[cp->NumberOfCommands][local_50] = pcVar4;
          if (__ptr[cp->NumberOfCommands][local_50] == (char *)0x0) break;
        }
        if (local_50 < lVar5) {
          for (; 0 < local_50; local_50 = local_50 + -1) {
            free(__ptr[cp->NumberOfCommands][local_50 + -1]);
          }
          free(__ptr);
          return 0;
        }
        __ptr[cp->NumberOfCommands][lVar5] = (char *)0x0;
      }
      else {
        ppcVar2 = cmsysSystem_Parse_CommandForUnix(*command,0);
        __ptr[cp->NumberOfCommands] = ppcVar2;
        if ((__ptr[cp->NumberOfCommands] == (char **)0x0) ||
           (*__ptr[cp->NumberOfCommands] == (char *)0x0)) {
          free(__ptr);
          return 0;
        }
      }
      free(cp->Commands);
      cp->Commands = __ptr;
      cp->NumberOfCommands = iVar1;
      cp_local._4_4_ = 1;
    }
  }
  return cp_local._4_4_;
}

Assistant:

int kwsysProcess_AddCommand(kwsysProcess* cp, char const* const* command)
{
  int newNumberOfCommands;
  char*** newCommands;

  /* Make sure we have a command to add.  */
  if (!cp || !command || !*command) {
    return 0;
  }

  /* Allocate a new array for command pointers.  */
  newNumberOfCommands = cp->NumberOfCommands + 1;
  if (!(newCommands =
          (char***)malloc(sizeof(char**) * (size_t)(newNumberOfCommands)))) {
    /* Out of memory.  */
    return 0;
  }

  /* Copy any existing commands into the new array.  */
  {
    int i;
    for (i = 0; i < cp->NumberOfCommands; ++i) {
      newCommands[i] = cp->Commands[i];
    }
  }

  /* Add the new command.  */
  if (cp->Verbatim) {
    /* In order to run the given command line verbatim we need to
       parse it.  */
    newCommands[cp->NumberOfCommands] =
      kwsysSystem_Parse_CommandForUnix(*command, 0);
    if (!newCommands[cp->NumberOfCommands] ||
        !newCommands[cp->NumberOfCommands][0]) {
      /* Out of memory or no command parsed.  */
      free(newCommands);
      return 0;
    }
  } else {
    /* Copy each argument string individually.  */
    char const* const* c = command;
    kwsysProcess_ptrdiff_t n = 0;
    kwsysProcess_ptrdiff_t i = 0;
    while (*c++)
      ;
    n = c - command - 1;
    newCommands[cp->NumberOfCommands] =
      (char**)malloc((size_t)(n + 1) * sizeof(char*));
    if (!newCommands[cp->NumberOfCommands]) {
      /* Out of memory.  */
      free(newCommands);
      return 0;
    }
    for (i = 0; i < n; ++i) {
      assert(command[i]); /* Quiet Clang scan-build. */
      newCommands[cp->NumberOfCommands][i] = strdup(command[i]);
      if (!newCommands[cp->NumberOfCommands][i]) {
        break;
      }
    }
    if (i < n) {
      /* Out of memory.  */
      for (; i > 0; --i) {
        free(newCommands[cp->NumberOfCommands][i - 1]);
      }
      free(newCommands);
      return 0;
    }
    newCommands[cp->NumberOfCommands][n] = 0;
  }

  /* Successfully allocated new command array.  Free the old array. */
  free(cp->Commands);
  cp->Commands = newCommands;
  cp->NumberOfCommands = newNumberOfCommands;

  return 1;
}